

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2DataBuilder::writeCSourceFile(Normalizer2DataBuilder *this,char *filename)

{
  ushort uVar1;
  char *str;
  char *pcVar2;
  FILE *__stream;
  undefined8 extraout_RAX;
  __off_t __length;
  int32_t length;
  char16_t *p;
  LocalUCPTriePointer norm16Trie;
  IcuToolErrorCode errorCode;
  CharString dataName;
  CharString path;
  char line [100];
  undefined1 local_148 [16];
  UErrorCode local_138 [2];
  char *local_130;
  StringPiece local_128;
  CharString local_118;
  CharString local_d8;
  char local_98 [104];
  
  processData((Normalizer2DataBuilder *)local_148);
  local_138[0] = U_ZERO_ERROR;
  local_148._8_8_ = &PTR__IcuToolErrorCode_003aef48;
  local_130 = "gennorm2/writeCSourceFile()";
  str = findBasename(filename);
  MaybeStackArray<char,_40>::MaybeStackArray(&local_d8.buffer);
  local_d8.len = 0;
  *local_d8.buffer.ptr = '\0';
  CharString::append(&local_d8,filename,(int)str - (int)filename,local_138);
  StringPiece::StringPiece(&local_128,str);
  MaybeStackArray<char,_40>::MaybeStackArray(&local_118.buffer);
  local_118.len = 0;
  *local_118.buffer.ptr = '\0';
  CharString::append(&local_118,local_128.ptr_,local_128.length_,local_138);
  pcVar2 = strrchr(str,0x2e);
  if (pcVar2 != (char *)0x0) {
    CharString::truncate(&local_118,(char *)(ulong)(uint)((int)pcVar2 - (int)str),__length);
  }
  ErrorCode::assertSuccess((ErrorCode *)(local_148 + 8));
  __stream = (FILE *)usrc_create(local_d8.buffer.ptr,str,0x7e0,
                                 "icu/source/tools/gennorm2/n2builder.cpp");
  if (__stream != (FILE *)0x0) {
    fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n",__stream);
    sprintf(local_98,"static const UVersionInfo %s_formatVersion={",local_118.buffer.ptr);
    usrc_writeArray((FILE *)__stream,local_98,::dataInfo.formatVersion,8,4,"};\n");
    sprintf(local_98,"static const UVersionInfo %s_dataVersion={",local_118.buffer.ptr);
    usrc_writeArray((FILE *)__stream,local_98,::dataInfo.dataVersion,8,4,"};\n\n");
    sprintf(local_98,"static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n",
            local_118.buffer.ptr);
    usrc_writeArray((FILE *)__stream,local_98,this->indexes,0x20,0x14,"\n};\n\n");
    usrc_writeUCPTrie((FILE *)__stream,local_118.buffer.ptr,(UCPTrie *)local_148._0_8_);
    p = (char16_t *)0x0;
    sprintf(local_98,"static const uint16_t %s_extraData[%%ld]={\n",local_118.buffer.ptr);
    uVar1 = (this->extraData).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        p = (this->extraData).fUnion.fFields.fArray;
      }
      else {
        p = (char16_t *)((long)&(this->extraData).fUnion + 2);
      }
    }
    if ((short)uVar1 < 0) {
      length = (this->extraData).fUnion.fFields.fLength;
    }
    else {
      length = (int)(short)uVar1 >> 5;
    }
    usrc_writeArray((FILE *)__stream,local_98,p,0x10,length,"\n};\n\n");
    sprintf(local_98,"static const uint8_t %s_smallFCD[%%ld]={\n",local_118.buffer.ptr);
    usrc_writeArray((FILE *)__stream,local_98,this->smallFCD,8,0x100,"\n};\n\n");
    fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n",__stream);
    fclose(__stream);
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_118.buffer);
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_d8.buffer);
    IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)(local_148 + 8));
    LocalUCPTriePointer::~LocalUCPTriePointer((LocalUCPTriePointer *)local_148);
    return;
  }
  writeCSourceFile((Normalizer2DataBuilder *)filename);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_118.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_d8.buffer);
  IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)(local_148 + 8));
  LocalUCPTriePointer::~LocalUCPTriePointer((LocalUCPTriePointer *)local_148);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
Normalizer2DataBuilder::writeCSourceFile(const char *filename) {
    LocalUCPTriePointer norm16Trie = processData();

    IcuToolErrorCode errorCode("gennorm2/writeCSourceFile()");
    const char *basename=findBasename(filename);
    CharString path(filename, (int32_t)(basename-filename), errorCode);
    CharString dataName(basename, errorCode);
    const char *extension=strrchr(basename, '.');
    if(extension!=NULL) {
        dataName.truncate((int32_t)(extension-basename));
    }
    const char *name=dataName.data();
    errorCode.assertSuccess();

    FILE *f=usrc_create(path.data(), basename, 2016, "icu/source/tools/gennorm2/n2builder.cpp");
    if(f==NULL) {
        fprintf(stderr, "gennorm2/writeCSourceFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n", f);

    char line[100];
    sprintf(line, "static const UVersionInfo %s_formatVersion={", name);
    usrc_writeArray(f, line, dataInfo.formatVersion, 8, 4, "};\n");
    sprintf(line, "static const UVersionInfo %s_dataVersion={", name);
    usrc_writeArray(f, line, dataInfo.dataVersion, 8, 4, "};\n\n");
    sprintf(line, "static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n", name);
    usrc_writeArray(f, line, indexes, 32, Normalizer2Impl::IX_COUNT, "\n};\n\n");

    usrc_writeUCPTrie(f, name, norm16Trie.getAlias());

    sprintf(line, "static const uint16_t %s_extraData[%%ld]={\n", name);
    usrc_writeArray(f, line, extraData.getBuffer(), 16, extraData.length(), "\n};\n\n");
    sprintf(line, "static const uint8_t %s_smallFCD[%%ld]={\n", name);
    usrc_writeArray(f, line, smallFCD, 8, sizeof(smallFCD), "\n};\n\n");

    fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n", f);
    fclose(f);
}